

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

BOOL __thiscall
Js::SmallSpanSequence::RecordARange
          (SmallSpanSequence *this,SmallSpanSequenceIter *iter,StatementData *data)

{
  GrowingArray<unsigned_int,_Memory::HeapAllocator> *this_00;
  code *pcVar1;
  bool bVar2;
  uint item;
  undefined4 *puVar3;
  GrowingUint32HeapArray *pGVar4;
  SmallSpan local_24;
  StatementData *pSStack_20;
  SmallSpan span;
  StatementData *data_local;
  SmallSpanSequenceIter *iter_local;
  SmallSpanSequence *this_local;
  
  pSStack_20 = data;
  if (data == (StatementData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x5b1,"(data)","data");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->pStatementBuffer == (GrowingUint32HeapArray *)0x0) {
    pGVar4 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Create(4);
    this->pStatementBuffer = pGVar4;
    this->baseValue = pSStack_20->sourceBegin;
    Reset(this,iter);
  }
  SmallSpan::SmallSpan(&local_24,0);
  local_24.sourceBegin = GetDiff(this,pSStack_20->sourceBegin,iter->accumulatedSourceBegin);
  local_24.bytecodeBegin = GetDiff(this,pSStack_20->bytecodeBegin,iter->accumulatedBytecodeBegin);
  this_00 = this->pStatementBuffer;
  item = SmallSpan::operator_cast_to_unsigned_int(&local_24);
  JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Add(this_00,item);
  iter->accumulatedSourceBegin = pSStack_20->sourceBegin;
  iter->accumulatedBytecodeBegin = pSStack_20->bytecodeBegin;
  return 1;
}

Assistant:

BOOL SmallSpanSequence::RecordARange(SmallSpanSequenceIter &iter, StatementData * data)
    {
        Assert(data);

        if (!this->pStatementBuffer)
        {
            this->pStatementBuffer = JsUtil::GrowingUint32HeapArray::Create(4);
            baseValue = data->sourceBegin;
            Reset(iter);
        }

        SmallSpan span(0);

        span.sourceBegin = GetDiff(data->sourceBegin, iter.accumulatedSourceBegin);
        span.bytecodeBegin = GetDiff(data->bytecodeBegin, iter.accumulatedBytecodeBegin);

        this->pStatementBuffer->Add((uint32)span);

        // Update iterator for the next set

        iter.accumulatedSourceBegin = data->sourceBegin;
        iter.accumulatedBytecodeBegin = data->bytecodeBegin;

        return TRUE;
    }